

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bin_io_json.cpp
# Opt level: O0

ErrorStackOption *
ritobin::io::json_impl::json_value_impl<ritobin::Hash,_(ritobin::Category)4>::from_json
          (ErrorStackOption *__return_storage_ptr__,Hash *value,json *json)

{
  bool bVar1;
  undefined1 local_50 [48];
  json *local_20;
  json *json_local;
  Hash *value_local;
  
  local_20 = json;
  json_local = (json *)value;
  value_local = (Hash *)__return_storage_ptr__;
  bVar1 = hash_from_json<ritobin::FNV1a>(&value->value,json);
  if (bVar1) {
    std::optional<ritobin::io::json_impl::ErrorStack>::optional(__return_storage_ptr__);
  }
  else {
    local_50._0_8_ = "hash";
    local_50._8_8_ = "hash_from_json(value.value, json)";
    std::__cxx11::string::string((string *)(local_50 + 0x10));
    std::optional<ritobin::io::json_impl::ErrorStack>::
    optional<ritobin::io::json_impl::ErrorStack,_true>
              (__return_storage_ptr__,(ErrorStack *)local_50);
    ErrorStack::~ErrorStack((ErrorStack *)local_50);
  }
  return __return_storage_ptr__;
}

Assistant:

static ErrorStackOption from_json(T& value, json const& json) noexcept {
            bin_json_assert(hash_from_json(value.value, json));
            return std::nullopt;
        }